

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.h
# Opt level: O0

bool __thiscall
crnlib::dxt1_endpoint_optimizer::potential_solution::are_selectors_all_equal
          (potential_solution *this)

{
  uchar uVar1;
  bool bVar2;
  uint uVar3;
  uchar *puVar4;
  uint local_20;
  uint i;
  uint s;
  potential_solution *this_local;
  
  bVar2 = vector<unsigned_char>::empty(&this->m_selectors);
  if (bVar2) {
    this_local._7_1_ = false;
  }
  else {
    puVar4 = vector<unsigned_char>::operator[](&this->m_selectors,0);
    uVar1 = *puVar4;
    for (local_20 = 1; uVar3 = vector<unsigned_char>::size(&this->m_selectors), local_20 < uVar3;
        local_20 = local_20 + 1) {
      puVar4 = vector<unsigned_char>::operator[](&this->m_selectors,local_20);
      if (*puVar4 != uVar1) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool are_selectors_all_equal() const
            {
                if (m_selectors.empty())
                {
                    return false;
                }
                const uint s = m_selectors[0];
                for (uint i = 1; i < m_selectors.size(); i++)
                {
                    if (m_selectors[i] != s)
                    {
                        return false;
                    }
                }
                return true;
            }